

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int document_length(lua_State *L)

{
  int iVar1;
  uint32_t uVar2;
  void *pvVar3;
  size_t sVar4;
  document doc_1;
  int i;
  int s;
  int total;
  document doc;
  lua_State *L_local;
  
  iVar1 = lua_isuserdata(L,3);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,3);
    if (iVar1 == 5) {
      i = 0;
      sVar4 = lua_rawlen(L,3);
      for (doc_1._4_4_ = 1; (int)doc_1._4_4_ <= (int)sVar4; doc_1._4_4_ = doc_1._4_4_ + 1) {
        lua_rawgeti(L,3,(long)(int)doc_1._4_4_);
        pvVar3 = lua_touserdata(L,-1);
        if (pvVar3 == (void *)0x0) {
          lua_settop(L,-2);
          iVar1 = luaL_error(L,"Invalid document at %d",(ulong)doc_1._4_4_);
          return iVar1;
        }
        uVar2 = get_length(pvVar3);
        i = uVar2 + i;
        lua_settop(L,-2);
      }
      L_local._4_4_ = i;
    }
    else {
      L_local._4_4_ = luaL_error(L,"Insert need documents");
    }
  }
  else {
    pvVar3 = lua_touserdata(L,3);
    L_local._4_4_ = get_length(pvVar3);
  }
  return L_local._4_4_;
}

Assistant:

static int
document_length(lua_State *L) {
	if (lua_isuserdata(L, 3)) {
		document doc = lua_touserdata(L,3);
		return get_length(doc);
	}
	if (lua_istable(L,3)) {
		int total = 0;
		int s = lua_rawlen(L,3);
		int i;
		for (i=1;i<=s;i++) {
			lua_rawgeti(L, 3, i);
			document doc = lua_touserdata(L,-1);
			if (doc == NULL) {
				lua_pop(L,1);
				return luaL_error(L, "Invalid document at %d", i);
			} else {
				total += get_length(doc);
				lua_pop(L,1);
			}
		}
		return total;
	}
	return luaL_error(L, "Insert need documents");
}